

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall fmt::v10::detail::bigint::subtract_aligned(bigint *this,bigint *other)

{
  int iVar1;
  bigit other_00;
  bigint *pbVar2;
  bigint *in_RSI;
  char *in_RDI;
  size_t n;
  size_t j;
  int i;
  bigit borrow;
  int in_stack_ffffffffffffffcc;
  bigint *in_stack_ffffffffffffffe0;
  bigint *this_00;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  
  if (in_RSI->exp_ < *(int *)(in_RDI + 0xa8)) {
    assert_fail(in_RDI,in_stack_ffffffffffffffcc,(char *)0x373ed5);
  }
  iVar1 = compare((bigint *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                  in_stack_ffffffffffffffe0);
  if (iVar1 < 0) {
    assert_fail(in_RDI,in_stack_ffffffffffffffcc,(char *)0x373f03);
  }
  iVar1 = 0;
  other_00 = in_RSI->exp_ - *(int *)(in_RDI + 0xa8);
  this_00 = (bigint *)0x0;
  pbVar2 = (bigint *)buffer<unsigned_int>::size((buffer<unsigned_int> *)in_RSI);
  for (; this_00 != pbVar2;
      this_00 = (bigint *)((long)&(this_00->bigits_).super_buffer<unsigned_int>._vptr_buffer + 1)) {
    buffer<unsigned_int>::operator[]<unsigned_long>
              ((buffer<unsigned_int> *)in_RSI,(unsigned_long)this_00);
    subtract_bigits(in_RSI,iVar1,other_00,(bigit *)this_00);
    other_00 = other_00 + 1;
  }
  while (iVar1 != 0) {
    subtract_bigits(in_RSI,iVar1,other_00,(bigit *)this_00);
  }
  remove_leading_zeros(this_00);
  return;
}

Assistant:

FMT_CONSTEXPR20 void subtract_aligned(const bigint& other) {
    FMT_ASSERT(other.exp_ >= exp_, "unaligned bigints");
    FMT_ASSERT(compare(*this, other) >= 0, "");
    bigit borrow = 0;
    int i = other.exp_ - exp_;
    for (size_t j = 0, n = other.bigits_.size(); j != n; ++i, ++j)
      subtract_bigits(i, other.bigits_[j], borrow);
    while (borrow > 0) subtract_bigits(i, 0, borrow);
    remove_leading_zeros();
  }